

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_gen_keypair
              (mbedtls_ecp_group *grp,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi_uint *pmVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t count;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uchar rnd [66];
  uchar local_78 [72];
  
  pmVar1 = (grp->G).X.p;
  if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  uVar7 = grp->nbits + 7;
  uVar6 = uVar7 >> 3;
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    iVar3 = mbedtls_mpi_fill_random(d,uVar6,f_rng,p_rng);
    if (iVar3 == 0) {
      sVar4 = mbedtls_mpi_bitlen(d);
      uVar6 = grp->nbits;
      count = (sVar4 - 1) - uVar6;
      if (sVar4 - 1 < uVar6 || count == 0) {
        iVar3 = mbedtls_mpi_set_bit(d,uVar6,'\x01');
      }
      else {
        iVar3 = mbedtls_mpi_shift_r(d,count);
      }
      if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_set_bit(d,0,'\0'), iVar3 == 0)) &&
         (iVar3 = mbedtls_mpi_set_bit(d,1,'\0'), iVar3 == 0)) {
        iVar3 = mbedtls_mpi_set_bit(d,2,'\0');
      }
    }
  }
  else {
    if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
      return -0x4f80;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return -0x4f80;
    }
    iVar3 = (*f_rng)(p_rng,local_78,uVar6);
    bVar2 = false;
    if (iVar3 == 0) {
      iVar5 = 0x1f;
      do {
        iVar3 = mbedtls_mpi_read_binary(d,local_78,uVar6);
        if ((iVar3 != 0) ||
           (iVar3 = mbedtls_mpi_shift_r(d,(uVar7 & 0xfffffffffffffff8) - grp->nbits), iVar3 != 0))
        break;
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          bVar2 = true;
LAB_001590ea:
          iVar3 = 0;
          goto LAB_001590f3;
        }
        iVar3 = mbedtls_mpi_cmp_int(d,1);
        if ((-1 < iVar3) && (iVar3 = mbedtls_mpi_cmp_mpi(d,&grp->N), iVar3 < 0)) {
          bVar2 = false;
          goto LAB_001590ea;
        }
        iVar3 = (*f_rng)(p_rng,local_78,uVar6);
      } while (iVar3 == 0);
      bVar2 = false;
    }
LAB_001590f3:
    if (bVar2) {
      return -0x4d00;
    }
  }
  if (iVar3 == 0) {
    iVar3 = mbedtls_ecp_mul(grp,Q,d,&grp->G,f_rng,p_rng);
  }
  return iVar3;
}

Assistant:

int mbedtls_ecp_gen_keypair( mbedtls_ecp_group *grp, mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    size_t n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last three bits are unset */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
    }
    else
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;
        unsigned char rnd[MBEDTLS_ECP_MAX_BYTES];

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( f_rng( p_rng, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( d, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 );
    }
    else
#endif /* ECP_SHORTWEIERSTRASS */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

cleanup:
    if( ret != 0 )
        return( ret );

    return( mbedtls_ecp_mul( grp, Q, d, &grp->G, f_rng, p_rng ) );
}